

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O3

bool __thiscall
draco::RAnsSymbolEncoder<18>::ProbabilityLess::operator()(ProbabilityLess *this,int i,int j)

{
  pointer prVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)i;
  prVar1 = (this->probabilities->
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->probabilities->
                super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)prVar1 >> 3;
  uVar2 = uVar4;
  if ((uVar4 < uVar3) && (uVar2 = (ulong)j, uVar2 < uVar3)) {
    return prVar1[uVar4].prob < prVar1[uVar2].prob;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2);
}

Assistant:

bool operator()(int i, int j) const {
      return probabilities->at(i).prob < probabilities->at(j).prob;
    }